

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O3

void __thiscall gmlc::networking::TcpConnection::closeNoWait(TcpConnection *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ConnectionStates CVar2;
  element_type *peVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  uint __val;
  uint uVar5;
  int iVar6;
  long *plVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  uint uVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  ulong uVar11;
  undefined8 uVar12;
  uint __len;
  error_code ec;
  string __str;
  uint local_100 [2];
  long *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  LOCK();
  (this->triggerhalt)._M_base._M_i = true;
  UNLOCK();
  CVar2 = (this->state)._M_i;
  if (((uint)(CVar2 + 0xfffffffd) < 2) ||
     ((CVar2 == PRESTART && (((this->receivingHalt).activated._M_base._M_i & 1U) != 0)))) {
    concurrency::TriggerVariable::trigger(&this->receivingHalt);
  }
  local_100[0] = 0;
  plVar7 = (long *)std::_V2::system_category();
  local_f8 = plVar7;
  iVar6 = (*((this->socket_).
             super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_Socket[8])();
  if ((char)iVar6 == '\0') goto LAB_0040d07c;
  peVar3 = (this->socket_).super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar3->_vptr_Socket[9])(peVar3,local_100);
  if (local_100[0] == 0) goto LAB_0040d07c;
  if ((local_100[0] != 0x68) && (local_100[0] != 0x6b)) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"error occurred sending shutdown::","");
    (**(code **)(*local_f8 + 0x20))(&local_50,local_f8,local_100[0]);
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar12 = local_90.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_50._M_string_length + local_90._M_string_length) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        uVar12 = local_50.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_50._M_string_length + local_90._M_string_length) goto LAB_0040cda1;
      pbVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::replace(&local_50,0,0,local_90._M_dataplus._M_p,local_90._M_string_length);
    }
    else {
LAB_0040cda1:
      pbVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::_M_append(&local_90,local_50._M_dataplus._M_p,local_50._M_string_length);
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(pbVar8->_M_dataplus)._M_p;
    paVar1 = &pbVar8->field_2;
    if (paVar10 == paVar1) {
      local_d0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    }
    else {
      local_d0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_d0._M_dataplus._M_p = (pointer)paVar10;
    }
    local_d0._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar1;
    pbVar8->_M_string_length = 0;
    paVar1->_M_local_buf[0] = '\0';
    pbVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             append(&local_d0," ");
    paVar1 = &local_70.field_2;
    local_70._M_dataplus._M_p = (pbVar8->_M_dataplus)._M_p;
    paVar10 = &pbVar8->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == paVar10) {
      local_70.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
      local_70._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_70.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    }
    local_70._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
    pbVar8->_M_string_length = 0;
    (pbVar8->field_2)._M_local_buf[0] = '\0';
    __val = -local_100[0];
    if (0 < (int)local_100[0]) {
      __val = local_100[0];
    }
    __len = 1;
    if (9 < __val) {
      uVar11 = (ulong)__val;
      uVar5 = 4;
      do {
        __len = uVar5;
        uVar9 = (uint)uVar11;
        if (uVar9 < 100) {
          __len = __len - 2;
          goto LAB_0040cecf;
        }
        if (uVar9 < 1000) {
          __len = __len - 1;
          goto LAB_0040cecf;
        }
        if (uVar9 < 10000) goto LAB_0040cecf;
        uVar11 = uVar11 / 10000;
        uVar5 = __len + 4;
      } while (99999 < uVar9);
      __len = __len + 1;
    }
LAB_0040cecf:
    iVar6 = (int)local_100[0] >> 0x1f;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_construct(&local_f0,(ulong)(__len + -iVar6),'-');
    CLI::std::__detail::__to_chars_10_impl<unsigned_int>
              (local_f0._M_dataplus._M_p + (uint)-iVar6,__len,__val);
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      uVar12 = local_70.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_f0._M_string_length + local_70._M_string_length) {
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        uVar12 = local_f0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_f0._M_string_length + local_70._M_string_length) goto LAB_0040cf4f;
      pbVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::replace(&local_f0,0,0,local_70._M_dataplus._M_p,local_70._M_string_length);
    }
    else {
LAB_0040cf4f:
      pbVar8 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::_M_append(&local_70,local_f0._M_dataplus._M_p,local_f0._M_string_length);
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar8->_M_dataplus)._M_p;
    paVar10 = &pbVar8->field_2;
    if (paVar4 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)paVar10) {
      local_b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
    }
    else {
      local_b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      local_b0._M_dataplus._M_p = (pointer)paVar4;
    }
    local_b0._M_string_length = pbVar8->_M_string_length;
    (pbVar8->_M_dataplus)._M_p = (pointer)paVar10;
    pbVar8->_M_string_length = 0;
    paVar10->_M_local_buf[0] = '\0';
    logger(this,0,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  local_100[0] = 0;
  local_f8 = plVar7;
LAB_0040d07c:
  peVar3 = (this->socket_).super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar3->_vptr_Socket[10])(peVar3,local_100);
  return;
}

Assistant:

void TcpConnection::closeNoWait()
{
    triggerhalt.store(true);
    switch (state.load()) {
        case ConnectionStates::PRESTART:
            if (receivingHalt.isActive()) {
                receivingHalt.trigger();
            }
            break;
        case ConnectionStates::HALTED:
        case ConnectionStates::CLOSED:
            receivingHalt.trigger();
            break;
        default:
            break;
    }

    std::error_code ec;
    if (socket_->is_open()) {
        socket_->shutdown(ec);
        if (ec) {
            if ((ec.value() != asio::error::not_connected) &&
                (ec.value() != asio::error::connection_reset)) {
                logger(
                    0,
                    std::string("error occurred sending shutdown::") +
                        ec.message() + " " + std::to_string(ec.value()));
            }
            ec.clear();
        }
        socket_->close(ec);
    } else {
        socket_->close(ec);
    }
}